

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3x3 * ConvexDecomposition::operator+(float3x3 *a,float3x3 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float3x3 *in_RDI;
  
  auVar8 = vinsertps_avx(ZEXT416((uint)((a->x).x + (b->x).x)),ZEXT416((uint)((a->x).y + (b->x).y)),
                         0x10);
  fVar1 = (a->x).z;
  fVar2 = (b->x).z;
  auVar9 = vinsertps_avx(ZEXT416((uint)((a->y).x + (b->y).x)),ZEXT416((uint)((a->y).y + (b->y).y)),
                         0x10);
  fVar3 = (a->y).z;
  fVar4 = (b->y).z;
  auVar10 = vinsertps_avx(ZEXT416((uint)((a->z).x + (b->z).x)),ZEXT416((uint)((a->z).y + (b->z).y)),
                          0x10);
  fVar5 = (a->z).z;
  fVar6 = (b->z).z;
  uVar7 = vmovlps_avx(auVar8);
  (in_RDI->x).x = (float)(int)uVar7;
  (in_RDI->x).y = (float)(int)((ulong)uVar7 >> 0x20);
  (in_RDI->x).z = fVar1 + fVar2;
  uVar7 = vmovlps_avx(auVar9);
  (in_RDI->y).x = (float)(int)uVar7;
  (in_RDI->y).y = (float)(int)((ulong)uVar7 >> 0x20);
  (in_RDI->y).z = fVar3 + fVar4;
  uVar7 = vmovlps_avx(auVar10);
  (in_RDI->z).x = (float)(int)uVar7;
  (in_RDI->z).y = (float)(int)((ulong)uVar7 >> 0x20);
  (in_RDI->z).z = fVar5 + fVar6;
  return in_RDI;
}

Assistant:

float3x3 operator+( const float3x3& a, const float3x3& b )
{
	return float3x3(a.x+b.x, a.y+b.y, a.z+b.z);
}